

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes RememberBitVector(CSzData *sd,UInt32 numItems,Byte **v)

{
  uint uVar1;
  UInt32 numBytes;
  Byte **v_local;
  UInt32 numItems_local;
  CSzData *sd_local;
  
  uVar1 = numItems + 7 >> 3;
  if (sd->Size < (ulong)uVar1) {
    sd_local._4_4_ = 0x10;
  }
  else {
    *v = sd->Data;
    sd->Size = sd->Size - (ulong)uVar1;
    sd->Data = sd->Data + uVar1;
    sd_local._4_4_ = 0;
  }
  return sd_local._4_4_;
}

Assistant:

static SRes RememberBitVector(CSzData *sd, UInt32 numItems, const Byte **v)
{
  UInt32 numBytes = (numItems + 7) >> 3;
  if (numBytes > sd->Size)
    return SZ_ERROR_ARCHIVE;
  *v = sd->Data;
  SKIP_DATA(sd, numBytes);
  return SZ_OK;
}